

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

bool compareProvisioningTeams(QVariantMap *a,QVariantMap *b)

{
  byte bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3.m_data = (storage_type *)0x16;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar3);
  local_98.d.d = (Data *)local_58.shared;
  local_98.d.ptr = (char16_t *)local_58._8_8_;
  local_98.d.size = local_58._16_8_;
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  local_60 = 2;
  QMap<QString,_QVariant>::value((QVariant *)&local_58,a,&local_98,(QVariant *)&local_78);
  bVar1 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_78);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar4.m_data = (storage_type *)0x16;
  QVar4.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar4);
  local_98.d.d = (Data *)local_58.shared;
  local_98.d.ptr = (char16_t *)local_58._8_8_;
  local_98.d.size = local_58._16_8_;
  local_78.shared = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  local_60 = 2;
  QMap<QString,_QVariant>::value((QVariant *)&local_58,b,&local_98,(QVariant *)&local_78);
  bVar2 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_78);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar2 & (bVar1 ^ 1));
  }
  __stack_chk_fail();
}

Assistant:

static bool compareProvisioningTeams(const QVariantMap &a, const QVariantMap &b)
{
    int aFree = a.value(QLatin1String("isFreeProvisioningTeam")).toBool() ? 1 : 0;
    int bFree = b.value(QLatin1String("isFreeProvisioningTeam")).toBool() ? 1 : 0;
    return aFree < bFree;
}